

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O2

void __thiscall
avro::BinaryDecoder::decodeBytes
          (BinaryDecoder *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  int iVar1;
  
  iVar1 = (*(this->super_Decoder)._vptr_Decoder[5])();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(value,(long)iVar1);
  if (iVar1 != 0) {
    StreamReader::readBytes
              (&this->in_,
               (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,(long)iVar1);
    return;
  }
  return;
}

Assistant:

void BinaryDecoder::decodeBytes(std::vector<uint8_t>& value)
{
    size_t len = decodeInt();
    value.resize(len);
    if (len > 0) {
        in_.readBytes(&value[0], len);
    }
}